

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O0

void Ivy_GraphPrepare(Dec_Graph_t *pGraph,Ivy_Cut_t *pCut,Vec_Ptr_t *vFanins,char *pPerm)

{
  uint uVar1;
  int iVar2;
  Dec_Node_t *pDVar3;
  void *pvVar4;
  Dec_Node_t *pDVar5;
  Dec_Node_t *pDVar6;
  int local_44;
  int i;
  Dec_Node_t *pNode1;
  Dec_Node_t *pNode0;
  Dec_Node_t *pNode;
  char *pPerm_local;
  Vec_Ptr_t *vFanins_local;
  Ivy_Cut_t *pCut_local;
  Dec_Graph_t *pGraph_local;
  
  iVar2 = Dec_GraphLeaveNum(pGraph);
  if (iVar2 != pCut->nSize) {
    __assert_fail("Dec_GraphLeaveNum(pGraph) == pCut->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivySeq.c"
                  ,0x170,"void Ivy_GraphPrepare(Dec_Graph_t *, Ivy_Cut_t *, Vec_Ptr_t *, char *)");
  }
  iVar2 = Vec_PtrSize(vFanins);
  if (iVar2 != pCut->nSize) {
    __assert_fail("Vec_PtrSize(vFanins) == pCut->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivySeq.c"
                  ,0x171,"void Ivy_GraphPrepare(Dec_Graph_t *, Ivy_Cut_t *, Vec_Ptr_t *, char *)");
  }
  for (local_44 = 0; local_44 < pGraph->nLeaves; local_44 = local_44 + 1) {
    pDVar3 = Dec_GraphNode(pGraph,local_44);
    pvVar4 = Vec_PtrEntry(vFanins,local_44);
    (pDVar3->field_2).pFunc = pvVar4;
    iVar2 = Ivy_LeafLat(pCut->pArray[(int)pPerm[local_44]]);
    *(uint *)&pDVar3->field_0x10 = *(uint *)&pDVar3->field_0x10 & 0x7ffffff | iVar2 << 0x1b;
  }
  for (local_44 = pGraph->nLeaves; local_44 < pGraph->nSize; local_44 = local_44 + 1) {
    pDVar3 = Dec_GraphNode(pGraph,local_44);
    pDVar5 = Dec_GraphNode(pGraph,(uint)pDVar3->eEdge0 >> 1 & 0x3fffffff);
    pDVar6 = Dec_GraphNode(pGraph,(uint)pDVar3->eEdge1 >> 1 & 0x3fffffff);
    if (*(uint *)&pDVar5->field_0x10 >> 0x1b < *(uint *)&pDVar6->field_0x10 >> 0x1b) {
      uVar1 = *(uint *)&pDVar5->field_0x10;
    }
    else {
      uVar1 = *(uint *)&pDVar6->field_0x10;
    }
    *(uint *)&pDVar3->field_0x10 = *(uint *)&pDVar3->field_0x10 & 0x7ffffff | uVar1 & 0xf8000000;
    *(uint *)&pDVar3->field_0x10 =
         *(uint *)&pDVar3->field_0x10 & 0xffc1ffff |
         ((*(uint *)&pDVar5->field_0x10 >> 0x1b) - (*(uint *)&pDVar3->field_0x10 >> 0x1b) & 0x1f) <<
         0x11;
    *(uint *)&pDVar3->field_0x10 =
         *(uint *)&pDVar3->field_0x10 & 0xf83fffff |
         ((*(uint *)&pDVar6->field_0x10 >> 0x1b) - (*(uint *)&pDVar3->field_0x10 >> 0x1b) & 0x1f) <<
         0x16;
  }
  return;
}

Assistant:

void Ivy_GraphPrepare( Dec_Graph_t * pGraph, Ivy_Cut_t * pCut, Vec_Ptr_t * vFanins, char * pPerm )
{
    Dec_Node_t * pNode, * pNode0, * pNode1;
    int i;
    assert( Dec_GraphLeaveNum(pGraph) == pCut->nSize );
    assert( Vec_PtrSize(vFanins) == pCut->nSize );
    // label the leaves with latch numbers
    Dec_GraphForEachLeaf( pGraph, pNode, i )
    {
        pNode->pFunc = Vec_PtrEntry( vFanins, i );
        pNode->nLat2 = Ivy_LeafLat( pCut->pArray[(int)pPerm[i]] );
    }
    // propagate latches through the nodes
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        // get the children of this node
        pNode0 = Dec_GraphNode( pGraph, pNode->eEdge0.Node );
        pNode1 = Dec_GraphNode( pGraph, pNode->eEdge1.Node );
        // distribute the latches
        pNode->nLat2 = IVY_MIN( pNode0->nLat2, pNode1->nLat2 );
        pNode->nLat0 = pNode0->nLat2 - pNode->nLat2;
        pNode->nLat1 = pNode1->nLat2 - pNode->nLat2;
    }
}